

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject_private.hh
# Opt level: O0

void __thiscall
QPDFObject::setChildDescription
          (QPDFObject *this,QPDF *a_qpdf,shared_ptr<QPDFObject> *parent,string_view *static_descr,
          string *var_descr)

{
  string *static_descr_00;
  string local_a8;
  shared_ptr<QPDFObject> local_88;
  ChildDescr local_78;
  undefined1 local_40 [24];
  string *var_descr_local;
  string_view *static_descr_local;
  shared_ptr<QPDFObject> *parent_local;
  QPDF *a_qpdf_local;
  QPDFObject *this_local;
  
  local_40._16_8_ = var_descr;
  var_descr_local = (string *)static_descr;
  static_descr_local = (string_view *)parent;
  parent_local = (shared_ptr<QPDFObject> *)a_qpdf;
  a_qpdf_local = (QPDF *)this;
  std::shared_ptr<QPDFObject>::shared_ptr(&local_88,parent);
  static_descr_00 = var_descr_local;
  std::__cxx11::string::string((string *)&local_a8,(string *)var_descr);
  ChildDescr::ChildDescr(&local_78,&local_88,(string_view *)static_descr_00,&local_a8);
  std::
  make_shared<std::variant<std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>,QPDFObject::ChildDescr>
            ((ChildDescr *)local_40);
  std::
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  ::operator=(&this->object_description,
              (shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
               *)local_40);
  std::
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  ::~shared_ptr((shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
                 *)local_40);
  ChildDescr::~ChildDescr(&local_78);
  std::__cxx11::string::~string((string *)&local_a8);
  std::shared_ptr<QPDFObject>::~shared_ptr(&local_88);
  this->qpdf = (QPDF *)parent_local;
  return;
}

Assistant:

void
    setChildDescription(
        QPDF* a_qpdf,
        std::shared_ptr<QPDFObject> parent,
        std::string_view const& static_descr,
        std::string var_descr)
    {
        object_description =
            std::make_shared<Description>(ChildDescr(parent, static_descr, var_descr));
        qpdf = a_qpdf;
    }